

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

string * __thiscall
google::protobuf::internal::TaggedStringPtr::TagAs(TaggedStringPtr *this,Type type,string *p)

{
  LogMessageFatal LStack_28;
  
  if (p != (string *)0x0) {
    assert_aligned(p);
    this->ptr_ = (void *)((ulong)type | (ulong)p);
    return p;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
             ,0xc1,"p != nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_28);
}

Assistant:

inline std::string* TagAs(Type type, std::string* p) {
    ABSL_DCHECK(p != nullptr);
    assert_aligned(p);
    ptr_ = reinterpret_cast<void*>(reinterpret_cast<uintptr_t>(p) | type);
    return p;
  }